

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzz_issue_tests.cpp
# Opt level: O3

string * gtest_rtripFilesrtripProblems_EvalGenerateName__abi_cxx11_
                   (string *__return_storage_ptr__,TestParamInfo<int> *info)

{
  bool bVar1;
  testing atStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) goto LAB_00133fb3;
  testing::Range<int,int>(atStack_28,1,0x26,1);
  if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00133fb3;
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_20->_M_use_count = local_20->_M_use_count + 1;
    UNLOCK();
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00133fa6;
  }
  else {
    local_20->_M_use_count = local_20->_M_use_count + 1;
LAB_00133fa6:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
LAB_00133fb3:
  testing::internal::DefaultParamName<int>(__return_storage_ptr__,info);
  return __return_storage_ptr__;
}

Assistant:

TEST(fuzzFailures, rtripSingleProblems)
{
    auto cdata = loadFailureFile("rtrip_fail", 37);
    auto u1 = unit_from_string(cdata);
    if (!is_error(u1)) {
        auto str = to_string(u1);
        std::cout << str << std::endl;
        auto u2 = unit_from_string(str);
        EXPECT_FALSE(is_error(u2));
        if (u2 == u1) {
            EXPECT_EQ(u2, u1);
            EXPECT_EQ(unit_cast(u2), unit_cast(u1));
            EXPECT_FALSE(units::unit_cast(u2) != units::unit_cast(u1));
        } else if (!is_error(root(u2, 2))) {
            EXPECT_EQ(root(unit_cast(u2), 2), root(unit_cast(u1), 2));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 2) != root(units::unit_cast(u1), 2));
        } else if (!is_error(root(u2, 3))) {
            EXPECT_EQ(root(unit_cast(u2), 3), root(unit_cast(u1), 3));
            EXPECT_FALSE(
                root(units::unit_cast(u2), 3) != root(units::unit_cast(u1), 3));
        } else {
            auto uc1 = unit_cast(u1);
            auto uc2 = unit_cast(u2);
            EXPECT_EQ(uc2, uc1);
            EXPECT_FALSE(uc2 != uc1);
        }
    }
}